

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Bech32.cpp
# Opt level: O0

void __thiscall Bech32Test_polymod_Test::~Bech32Test_polymod_Test(Bech32Test_polymod_Test *this)

{
  Bech32Test_polymod_Test *this_local;
  
  ~Bech32Test_polymod_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Bech32Test, polymod) {
    std::string hrp("A");
    std::vector<unsigned char> e = expandHrp(hrp);
    uint32_t p = polymod(e);
    ASSERT_EQ(p, 34817);

    hrp = "B";
    e = expandHrp(hrp);
    p = polymod(e);
    ASSERT_EQ(p, 34818);

    hrp = "qwerty";
    e = expandHrp(hrp);
    p = polymod(e);
    ASSERT_EQ(p, 448484437);
}